

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageTexelBuffer::submit
          (RenderVertexStorageTexelBuffer *this,SubmitContext *context)

{
  VkCommandBuffer pVVar1;
  DeviceInterface *pDVar2;
  pointer pHVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  pVVar1 = context->m_commandBuffer;
  pDVar2 = context->m_context->m_context->m_vkd;
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar1,0);
  pHVar3 = (this->m_descriptorSets).
           super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_descriptorSets).
      super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar3) {
    lVar7 = 0;
    uVar5 = 0;
    lVar4 = 0;
    do {
      uVar6 = this->m_maxStorageTexelCount;
      if (this->m_bufferSize < (lVar4 + 4) * (ulong)uVar6) {
        uVar6 = (int)this->m_bufferSize - (int)lVar4 * uVar6;
      }
      else {
        uVar6 = uVar6 << 2;
      }
      uVar5 = uVar5 + 1;
      (*pDVar2->_vptr_DeviceInterface[0x56])
                (pDVar2,pVVar1,0,
                 (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                 m_data.object.m_internal,0,1,(long)&pHVar3->m_internal + lVar7,0,0);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,pVVar1,(ulong)(uVar6 >> 1),1,0,0);
      pHVar3 = (this->m_descriptorSets).
               super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 8;
      lVar4 = lVar4 + 4;
    } while (uVar5 < (ulong)((long)(this->m_descriptorSets).
                                   super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3));
  }
  return;
}

Assistant:

void RenderVertexStorageTexelBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();

	vkd.cmdBindPipeline(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipeline);

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const deUint32 count	= (deUint32)(m_bufferSize < (descriptorSetNdx + 1) * m_maxStorageTexelCount * 4
								? m_bufferSize - descriptorSetNdx * m_maxStorageTexelCount * 4
								: m_maxStorageTexelCount * 4) / 2;

		vkd.cmdBindDescriptorSets(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipelineLayout, 0u, 1u, &m_descriptorSets[descriptorSetNdx], 0u, DE_NULL);
		vkd.cmdDraw(commandBuffer, count, 1, 0, 0);
	}
}